

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

char * rw::Image::getFilename(char *name)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  long lVar3;
  long lVar4;
  int iVar5;
  char *__s;
  long lVar6;
  
  lVar4 = engine;
  lVar6 = (long)imageModuleOffset;
  sVar1 = strlen(name);
  if (*(int *)(lVar4 + 8 + lVar6) == 0) {
    name = strdup_LOC(name,0x30000,
                      "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 938"
                     );
    makePath(name);
    lVar4 = (**(code **)(engine + 0x20))(name,"rb");
    if (lVar4 != 0) {
      (**(code **)(engine + 0x28))(lVar4);
      __dest = name;
LAB_0010ec65:
      printf("found %s\n",name);
      return __dest;
    }
    (*DAT_00149da0)(name);
  }
  else if (0 < *(int *)(lVar4 + 8 + lVar6)) {
    __s = *(char **)(lVar4 + lVar6);
    iVar5 = 0;
    do {
      sVar2 = strlen(__s);
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 950"
      ;
      __dest = (char *)(*Engine::memfuncs)(sVar2 + sVar1 + 1,0x30018);
      if (__dest == (char *)0x0) {
        getFilename();
        return (char *)0x0;
      }
      strcpy(__dest,__s);
      strcat(__dest,name);
      makePath(__dest);
      lVar3 = (**(code **)(engine + 0x20))(__dest,"r");
      if (lVar3 != 0) {
        (**(code **)(engine + 0x28))(lVar3);
        goto LAB_0010ec65;
      }
      (*DAT_00149da0)(__dest);
      sVar2 = strlen(__s);
      __s = __s + sVar2 + 1;
      iVar5 = iVar5 + 1;
    } while (iVar5 < *(int *)(lVar4 + 8 + lVar6));
  }
  return (char *)0x0;
}

Assistant:

char*
Image::getFilename(const char *name)
{
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	void *f;
	char *s, *p = g->searchPaths;
	size_t len = strlen(name)+1;
	if(g->numSearchPaths == 0){
		s = rwStrdup(name, MEMDUR_EVENT);
		makePath(s);
		f = engine->filefuncs.rwfopen(s, "rb");
		if(f){
			engine->filefuncs.rwfclose(f);
			printf("found %s\n", s);
			return s;
		}
		rwFree(s);
		return nil;
	}else
		for(int i = 0; i < g->numSearchPaths; i++){
			s = (char*)rwMalloc(strlen(p)+len, MEMDUR_EVENT | ID_IMAGE);
			if(s == nil){
				RWERROR((ERR_ALLOC, strlen(p)+len));
				return nil;
			}
			strcpy(s, p);
			strcat(s, name);
			makePath(s);
			f = engine->filefuncs.rwfopen(s, "r");
			if(f){
				engine->filefuncs.rwfclose(f);
				printf("found %s\n", name);
				return s;
			}
			rwFree(s);
			p += strlen(p) + 1;
		}
	return nil;
}